

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::anon_unknown_19::load_png_headers_intern
               (FILE *fp,ImageHeaders *headers,png_structp *png,png_infop *png_info)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  Exception *pEVar4;
  png_structp ppVar5;
  undefined8 uVar6;
  allocator local_101;
  string local_100 [32];
  uint local_e0;
  undefined1 local_da;
  allocator local_d9;
  int bit_depth;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [38];
  undefined1 local_8a;
  allocator local_89;
  string local_88 [35];
  undefined1 local_65;
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  png_byte signature [8];
  png_infop *png_info_local;
  png_structp *png_local;
  ImageHeaders *headers_local;
  FILE *fp_local;
  
  signature = (png_byte  [8])png_info;
  sVar3 = fread(local_30,1,8,(FILE *)fp);
  if (sVar3 != 8) {
    fclose((FILE *)fp);
    local_65 = 1;
    pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"PNG signature could not be read",&local_51);
    util::Exception::Exception(pEVar4,(string *)local_50);
    local_65 = 0;
    __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  iVar2 = png_sig_cmp(local_30,0,8);
  if (iVar2 != 0) {
    fclose((FILE *)fp);
    local_8a = 1;
    pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"PNG signature did not match",&local_89);
    util::Exception::Exception(pEVar4,(string *)local_88);
    local_8a = 0;
    __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  ppVar5 = (png_structp)png_create_read_struct("1.6.37",0,0);
  *png = ppVar5;
  if (*png == (png_structp)0x0) {
    fclose((FILE *)fp);
    local_b2 = 1;
    pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Out of memory",&local_b1);
    util::Exception::Exception(pEVar4,(string *)local_b0);
    local_b2 = 0;
    __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  uVar6 = png_create_info_struct(*png);
  *(undefined8 *)signature = uVar6;
  if (*(long *)signature == 0) {
    png_destroy_read_struct(png,0);
    fclose((FILE *)fp);
    local_da = 1;
    pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&bit_depth,"Out of memory",&local_d9);
    util::Exception::Exception(pEVar4,(string *)&bit_depth);
    local_da = 0;
    __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  png_init_io(*png,fp);
  png_set_sig_bytes(*png,8);
  png_read_info(*png,*(undefined8 *)signature);
  iVar2 = png_get_image_width(*png,*(undefined8 *)signature);
  headers->width = iVar2;
  iVar2 = png_get_image_height(*png,*(undefined8 *)signature);
  headers->height = iVar2;
  bVar1 = png_get_channels(*png,*(undefined8 *)signature);
  headers->channels = (uint)bVar1;
  bVar1 = png_get_bit_depth(*png,*(undefined8 *)signature);
  local_e0 = (uint)bVar1;
  if (local_e0 < 9) {
    headers->type = IMAGE_TYPE_UINT8;
  }
  else {
    if (local_e0 != 0x10) {
      png_destroy_read_struct(png,signature,0);
      fclose((FILE *)fp);
      pEVar4 = (Exception *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"PNG with unknown bit depth",&local_101);
      util::Exception::Exception(pEVar4,(string *)local_100);
      __cxa_throw(pEVar4,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    headers->type = IMAGE_TYPE_UINT16;
  }
  return;
}

Assistant:

void
    load_png_headers_intern (FILE* fp, ImageHeaders* headers,
        png_structp* png, png_infop* png_info)
    {
        /* Identify the PNG signature. */
        png_byte signature[8];
        if (std::fread(signature, 1, 8, fp) != 8)
        {
            std::fclose(fp);
            throw util::Exception("PNG signature could not be read");
        }
        if (png_sig_cmp(signature, 0, 8) != 0)
        {
            std::fclose(fp);
            throw util::Exception("PNG signature did not match");
        }

        /* Initialize PNG structures. */
        *png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
            nullptr, nullptr, nullptr);
        if (!*png)
        {
            std::fclose(fp);
            throw util::Exception("Out of memory");
        }

        *png_info = png_create_info_struct(*png);
        if (!*png_info)
        {
            png_destroy_read_struct(png, nullptr, nullptr);
            std::fclose(fp);
            throw util::Exception("Out of memory");
        }

        /* Init PNG file IO */
        png_init_io(*png, fp);
        png_set_sig_bytes(*png, 8);

        /* Read PNG header info. */
        png_read_info(*png, *png_info);

        headers->width = png_get_image_width(*png, *png_info);
        headers->height = png_get_image_height(*png, *png_info);
        headers->channels = png_get_channels(*png, *png_info);

        int const bit_depth = png_get_bit_depth(*png, *png_info);
        if (bit_depth <= 8)
            headers->type = IMAGE_TYPE_UINT8;
        else if (bit_depth == 16)
            headers->type = IMAGE_TYPE_UINT16;
        else
        {
            png_destroy_read_struct(png, png_info, nullptr);
            std::fclose(fp);
            throw util::Exception("PNG with unknown bit depth");
        }
    }